

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_sim.c
# Opt level: O1

int cvNlsInitSensSim(CVodeMem cvode_mem)

{
  int iVar1;
  code *pcVar2;
  char *msgfmt;
  
  if (cvode_mem->cv_lsetup ==
      (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)0x0) {
    pcVar2 = (code *)0x0;
  }
  else {
    pcVar2 = cvNlsLSetupSensSim;
  }
  iVar1 = SUNNonlinSolSetLSetupFn(cvode_mem->NLSsim,pcVar2);
  if (iVar1 == 0) {
    if (cvode_mem->cv_lsolve == (_func_int_CVodeMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector *)0x0
       ) {
      pcVar2 = (code *)0x0;
    }
    else {
      pcVar2 = cvNlsLSolveSensSim;
    }
    iVar1 = SUNNonlinSolSetLSolveFn(cvode_mem->NLSsim,pcVar2);
    if (iVar1 == 0) {
      iVar1 = SUNNonlinSolInitialize(cvode_mem->NLSsim);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "The nonlinear solver\'s init routine failed.";
      iVar1 = 0x11f;
    }
    else {
      msgfmt = "Setting linear solver solve function failed";
      iVar1 = 0x115;
    }
  }
  else {
    msgfmt = "Setting the linear solver setup function failed";
    iVar1 = 0x107;
  }
  cvProcessError(cvode_mem,-0x16,iVar1,"cvNlsInitSensSim",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_sim.c"
                 ,msgfmt);
  return -0xd;
}

Assistant:

int cvNlsInitSensSim(CVodeMem cvode_mem)
{
  int retval;

  /* set the linear solver setup wrapper function */
  if (cvode_mem->cv_lsetup)
  {
    retval = SUNNonlinSolSetLSetupFn(cvode_mem->NLSsim, cvNlsLSetupSensSim);
  }
  else { retval = SUNNonlinSolSetLSetupFn(cvode_mem->NLSsim, NULL); }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting the linear solver setup function failed");
    return (CV_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (cvode_mem->cv_lsolve)
  {
    retval = SUNNonlinSolSetLSolveFn(cvode_mem->NLSsim, cvNlsLSolveSensSim);
  }
  else { retval = SUNNonlinSolSetLSolveFn(cvode_mem->NLSsim, NULL); }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting linear solver solve function failed");
    return (CV_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(cvode_mem->NLSsim);

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_INIT_FAIL);
    return (CV_NLS_INIT_FAIL);
  }

  return (CV_SUCCESS);
}